

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O1

int init_socket(int port)

{
  int __fd;
  int iVar1;
  int *piVar2;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  int x;
  undefined4 local_2c;
  undefined8 local_28;
  char acStack_20 [8];
  char *local_18;
  
  local_2c = 1;
  __fd = socket(2,1,0);
  if (__fd < 0) {
    piVar2 = __errno_location();
    local_28 = strerror(*piVar2);
    fmt._M_str = "Init_socket: socket: {}";
    fmt._M_len = 0x17;
    CLogger::Error<char*>((CLogger *)&RS.field_0x140,fmt,(char **)&local_28);
  }
  else {
    iVar1 = setsockopt(__fd,1,2,&local_2c,4);
    if (iVar1 < 0) {
      piVar2 = __errno_location();
      local_28 = strerror(*piVar2);
      fmt_00._M_str = "Init_socket: SO_REUSEADDR: {}";
      fmt_00._M_len = 0x1d;
      CLogger::Error<char*>((CLogger *)&RS.field_0x140,fmt_00,(char **)&local_28);
    }
    else {
      acStack_20[0] = '\0';
      acStack_20[1] = '\0';
      acStack_20[2] = '\0';
      acStack_20[3] = '\0';
      acStack_20[4] = '\0';
      acStack_20[5] = '\0';
      acStack_20[6] = '\0';
      acStack_20[7] = '\0';
      local_28 = (char *)(ulong)CONCAT22((ushort)port << 8 | (ushort)port >> 8,2);
      iVar1 = bind(__fd,(sockaddr *)&local_28,0x10);
      if (iVar1 < 0) {
        init_socket();
      }
      else {
        iVar1 = listen(__fd,3);
        if (-1 < iVar1) {
          return __fd;
        }
      }
      piVar2 = __errno_location();
      local_18 = strerror(*piVar2);
      fmt_01._M_str = "Init_socket: listen: {}";
      fmt_01._M_len = 0x17;
      CLogger::Warn<char*>((CLogger *)&RS.field_0x140,fmt_01,&local_18);
    }
    close(__fd);
  }
  exit(0);
}

Assistant:

int init_socket(int port)
{
	static struct sockaddr_in sa_zero;
	struct sockaddr_in sa;
	int x = 1;
	int fd;
	int done = 0;

BIND_AGAIN:

	if ((fd = socket(AF_INET, SOCK_STREAM, 0)) < 0)
	{
		RS.Logger.Error("Init_socket: socket: {}", std::strerror(errno));
		exit(0);
	}

	if (setsockopt(fd, SOL_SOCKET, SO_REUSEADDR, (char *)&x, sizeof(x)) < 0)
	{
		RS.Logger.Error("Init_socket: SO_REUSEADDR: {}", std::strerror(errno));
		close(fd);
		exit(0);
	}
	/*
	#ifdef SO_DONTLINGER
		{
		struct	linger	ld;

		ld.l_onoff  = 1;
		ld.l_linger = 1000;

		if ( setsockopt( fd, SOL_SOCKET, SO_DONTLINGER,
		(char *) &ld, sizeof(ld) ) < 0 )
		{
			RS.Logger.Error("Init_socket: SO_DONTLINGER: {}", std::strerror(errno));
			close(fd);
			exit( SAFE_EXIT );
		}
		}
	#endif
	*/
	sa = sa_zero;
	sa.sin_family = AF_INET;
	sa.sin_port = htons(port);

	if (bind(fd, (struct sockaddr *)&sa, sizeof(sa)) < 0)
	{
		RS.Logger.Warn("Init_socket: bind: {}", std::strerror(errno));
		if (--done < 0)
		{
			fprintf(stderr, "Unable to allocate port.  Exiting.\n\r");
			close(fd);
			exit(0);
		}
		else
		{
			sleep(10);
			goto BIND_AGAIN;
		}
	}

	if (listen(fd, 3) < 0)
	{
		RS.Logger.Warn("Init_socket: listen: {}", std::strerror(errno));
		close(fd);
		exit(0);
	}

	return fd;
}